

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_pvo_get_str(void *in,char *name,char **result)

{
  lws_protocol_vhost_options *plVar1;
  
  plVar1 = lws_pvo_search((lws_protocol_vhost_options *)in,name);
  if (plVar1 != (lws_protocol_vhost_options *)0x0) {
    *result = plVar1->value;
  }
  return (uint)(plVar1 == (lws_protocol_vhost_options *)0x0);
}

Assistant:

int
lws_pvo_get_str(void *in, const char *name, const char **result)
{
	const struct lws_protocol_vhost_options *pv =
		lws_pvo_search((const struct lws_protocol_vhost_options *)in,
				name);

	if (!pv)
		return 1;

	*result = (const char *)pv->value;

	return 0;
}